

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# playerselect.c
# Opt level: O3

nh_bool find_align(nh_roles_info *ri,char *align_str,int *out_align)

{
  int iVar1;
  char **ppcVar2;
  int iVar3;
  long lVar4;
  
  iVar1 = ri->num_aligns;
  if (0 < (long)iVar1) {
    ppcVar2 = ri->alignnames;
    lVar4 = 0;
    do {
      iVar3 = strcmp(align_str,ppcVar2[lVar4]);
      if (iVar3 == 0) {
        *out_align = (int)lVar4;
        return '\x01';
      }
      lVar4 = lVar4 + 1;
    } while (iVar1 != lVar4);
  }
  return '\0';
}

Assistant:

static nh_bool find_align(const struct nh_roles_info *ri,
			  const char *align_str, int *out_align)
{
    int i;

    for (i = 0; i < ri->num_aligns; i++) {
	if (!strcmp(align_str, ri->alignnames[i])) {
	    *out_align = i;
	    return TRUE;
	}
    }
    return FALSE;
}